

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_tests.cpp
# Opt level: O1

void __thiscall omp_zip_val_types_Test::TestBody(omp_zip_val_types_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  vector<int,_std::allocator<int>_> initial2;
  vector<int,_std::allocator<int>_> initial1;
  zip<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  result;
  allocator_type local_e9;
  vector<int,_std::allocator<int>_> local_e8;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  undefined8 local_64;
  undefined4 local_5c;
  void *local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  void *local_40;
  long local_30;
  void *local_28;
  long local_18;
  
  local_58 = (void *)0x200000001;
  uStack_50 = 0x400000003;
  local_48 = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l,(allocator_type *)&local_e8);
  local_58 = (void *)0x700000006;
  uStack_50 = 0x900000008;
  local_48 = 0;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l_00,(allocator_type *)&local_64);
  std::vector<int,_std::allocator<int>_>::vector(&local_98,&local_80);
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_64 = 0x200000001;
  local_5c = 3;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_64;
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,__l_01,&local_e9);
  std::
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  ::
  _Tuple_impl<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,void>
            ((_Tuple_impl<0ul,std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)&local_58,&local_98,&local_c8,&local_b0);
  if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_28 != (void *)0x0) {
    operator_delete(local_28,local_18 - (long)local_28);
  }
  if (local_40 != (void *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
  }
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,CONCAT44(uStack_44,local_48) - (long)local_58);
  }
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(omp_zip, val_types) {
  const std::vector initial1 = {1, 2, 3, 4, 5};
  std::vector initial2 = {6, 7, 8, 9, 0};

  auto result = omp::zip(std::move(initial1), std::move(initial2),
                         std::vector<int>{1, 2, 3});

  auto f_is_const_val = std::is_same_v<
      std::add_const_t<decltype(initial1)>,
      std::tuple_element_t<0, std::decay_t<decltype(result.containers())>>>;

  auto s_is_val = std::is_same_v<
      decltype(initial2),
      std::tuple_element_t<1, std::decay_t<decltype(result.containers())>>>;

  auto t_is_val = std::is_same_v<
      std::vector<int>,
      std::tuple_element_t<2, std::decay_t<decltype(result.containers())>>>;

  ASSERT_TRUE(f_is_const_val && s_is_val && t_is_val);
}